

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *old)

{
  QArrayData *pQVar1;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  Int IVar5;
  long lVar6;
  ButtonInfo *pBVar7;
  qsizetype qVar8;
  ButtonInfo *pBVar9;
  ButtonInfo *pBVar10;
  ButtonInfo *this_00;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  pair<QTypedArrayData<(anonymous_namespace)::ButtonInfo>_*,_(anonymous_namespace)::ButtonInfo_*>
  pVar12;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->d->super_QArrayData;
  if (((pQVar1 == (QArrayData *)0x0 || where != GrowsAtEnd) || (n < 1)) ||
     (1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i)) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (ButtonInfo *)&DAT_aaaaaaaaaaaaaaaa;
    if (pQVar1 == (QArrayData *)0x0) {
      qVar8 = 0;
    }
    else {
      qVar8 = pQVar1->alloc;
    }
    if (qVar8 < this->size) {
      qVar8 = this->size;
    }
    if (where == GrowsAtEnd) {
      lVar2 = freeSpaceAtEnd(this);
    }
    else {
      lVar2 = freeSpaceAtBegin(this);
    }
    lVar2 = (qVar8 + n) - lVar2;
    if (pQVar1 == (QArrayData *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = pQVar1->alloc;
      lVar6 = lVar2;
      if (lVar2 < lVar4) {
        lVar6 = lVar4;
      }
      if (((pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar2 = lVar6;
      }
    }
    pVar12 = QTypedArrayData<(anonymous_namespace)::ButtonInfo>::allocate
                       (lVar2,(uint)(lVar2 <= lVar4));
    pBVar7 = pVar12.second;
    pDVar3 = pVar12.first;
    if (pBVar7 != (ButtonInfo *)0x0 && pDVar3 != (Data *)0x0) {
      if (where == GrowsAtBeginning) {
        lVar4 = ((pDVar3->super_QArrayData).alloc - (this->size + n)) / 2;
        lVar2 = 0;
        if (0 < lVar4) {
          lVar2 = lVar4;
        }
        lVar2 = lVar2 + n;
      }
      else {
        lVar2 = freeSpaceAtBegin(this);
      }
      if (this->d == (Data *)0x0) {
        IVar5 = 0;
      }
      else {
        IVar5 = (this->d->super_QArrayData).flags.
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                super_QFlagsStorage<QArrayData::ArrayOption>.i;
      }
      pBVar7 = pBVar7 + lVar2;
      (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar5;
    }
    local_58.size = 0;
    lVar2 = this->size;
    if (lVar2 == 0) {
      qVar8 = 0;
    }
    else {
      local_58.d = pDVar3;
      local_58.ptr = pBVar7;
      if ((this->d == (Data *)0x0) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QtPrivate::QGenericArrayOps<(anonymous_namespace)::ButtonInfo>::copyAppend
                  ((QGenericArrayOps<(anonymous_namespace)::ButtonInfo> *)&local_58,this->ptr,
                   this->ptr + lVar2);
        qVar8 = local_58.size;
        pDVar3 = local_58.d;
        pBVar7 = local_58.ptr;
      }
      else {
        pBVar10 = this->ptr;
        pBVar9 = pBVar10 + lVar2;
        qVar8 = 0;
        this_00 = pBVar7;
        for (; pBVar10 < pBVar9; pBVar10 = pBVar10 + 1) {
          anon_unknown.dwarf_511deb::ButtonInfo::ButtonInfo(this_00,pBVar10);
          qVar8 = qVar8 + 1;
          this_00 = this_00 + 1;
        }
      }
    }
    local_58.d = this->d;
    local_58.ptr = this->ptr;
    this->d = pDVar3;
    this->ptr = pBVar7;
    local_58.size = this->size;
    this->size = qVar8;
    ~QArrayDataPointer(&local_58);
  }
  else {
    lVar2 = pQVar1->alloc;
    qVar8 = freeSpaceAtEnd(this);
    auVar11 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x98,(lVar2 - qVar8) + 1,Grow);
    this->d = (Data *)auVar11._0_8_;
    this->ptr = (ButtonInfo *)auVar11._8_8_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }